

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_51;
  string local_50 [32];
  string *local_30;
  string *s;
  string *var;
  int i;
  int nMatches;
  char *nMatchesStr;
  cmMakefile *this_local;
  
  nMatchesStr = (char *)this;
  _i = GetDefinition(this,&nMatchesVariable_abi_cxx11_);
  if (_i != (char *)0x0) {
    var._4_4_ = atoi(_i);
    for (var._0_4_ = 0; (int)var <= var._4_4_; var._0_4_ = (int)var + 1) {
      s = matchVariables_abi_cxx11_ + (int)var;
      pcVar1 = GetSafeDefinition(this,s);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar1,&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      local_30 = local_50;
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        AddDefinition(this,s,"");
        MarkVariableAsUsed(this,s);
      }
      std::__cxx11::string::~string(local_50);
    }
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,"0");
    MarkVariableAsUsed(this,&nMatchesVariable_abi_cxx11_);
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  const char* nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr)
    {
    return;
    }
  int nMatches = atoi(nMatchesStr);
  for (int i=0; i<=nMatches; i++)
    {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if(!s.empty())
      {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
      }
    }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}